

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightParameters.cpp
# Opt level: O3

void __thiscall OpenMD::Perturbations::LightParameters::LightParameters(LightParameters *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  ParameterBase *local_78;
  ParameterBase *local_70;
  ParameterBase *local_68;
  ParameterBase *local_60;
  string *local_58;
  ParameterBase *local_50;
  string *local_48;
  ParameterBase *local_40;
  string *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__LightParameters_002fb570;
  local_40 = &(this->UseLight).super_ParameterBase;
  psVar2 = &(this->UseLight).super_ParameterBase.keyword_;
  local_80 = &(this->UseLight).super_ParameterBase.keyword_.field_2;
  (this->UseLight).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_80;
  (this->UseLight).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseLight).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseLight).super_ParameterBase.optional_ = false;
  (this->UseLight).super_ParameterBase.defaultValue_ = false;
  (this->UseLight).super_ParameterBase.empty_ = true;
  (this->UseLight).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f9c20;
  local_50 = &(this->Wavelength).super_ParameterBase;
  local_48 = (string *)&(this->Wavelength).super_ParameterBase.keyword_;
  local_88 = &(this->Wavelength).super_ParameterBase.keyword_.field_2;
  (this->Wavelength).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_88;
  (this->Wavelength).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Wavelength).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Wavelength).super_ParameterBase.optional_ = false;
  (this->Wavelength).super_ParameterBase.defaultValue_ = false;
  (this->Wavelength).super_ParameterBase.empty_ = true;
  (this->Wavelength).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f9c98;
  local_60 = &(this->Frequency).super_ParameterBase;
  local_58 = (string *)&(this->Frequency).super_ParameterBase.keyword_;
  local_90 = &(this->Frequency).super_ParameterBase.keyword_.field_2;
  (this->Frequency).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_90;
  (this->Frequency).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Frequency).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Frequency).super_ParameterBase.optional_ = false;
  (this->Frequency).super_ParameterBase.defaultValue_ = false;
  (this->Frequency).super_ParameterBase.empty_ = true;
  (this->Frequency).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f9c98;
  (this->PropagationDirection).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->PropagationDirection).super_ParameterBase.keyword_.field_2;
  (this->PropagationDirection).super_ParameterBase.keyword_._M_string_length = 0;
  (this->PropagationDirection).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->PropagationDirection).super_ParameterBase.optional_ = false;
  (this->PropagationDirection).super_ParameterBase.defaultValue_ = false;
  (this->PropagationDirection).super_ParameterBase.empty_ = true;
  (this->PropagationDirection).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fac48;
  (this->PropagationDirection).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PropagationDirection).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->PropagationDirection).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->WaveVector).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->WaveVector).super_ParameterBase.keyword_.field_2;
  local_68 = &(this->PropagationDirection).super_ParameterBase;
  (this->WaveVector).super_ParameterBase.keyword_._M_string_length = 0;
  (this->WaveVector).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->WaveVector).super_ParameterBase.optional_ = false;
  (this->WaveVector).super_ParameterBase.defaultValue_ = false;
  (this->WaveVector).super_ParameterBase.empty_ = true;
  (this->WaveVector).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002fac48;
  (this->WaveVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->WaveVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->WaveVector).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = &(this->Intensity).super_ParameterBase.keyword_.field_2;
  (this->Intensity).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_98;
  (this->Intensity).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Intensity).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Intensity).super_ParameterBase.optional_ = false;
  (this->Intensity).super_ParameterBase.defaultValue_ = false;
  (this->Intensity).super_ParameterBase.empty_ = true;
  (this->Intensity).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002f9c98;
  (this->Polarization).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Polarization).super_ParameterBase.keyword_.field_2;
  local_70 = &(this->WaveVector).super_ParameterBase;
  (this->Polarization).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Polarization).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Polarization).super_ParameterBase.optional_ = false;
  (this->Polarization).super_ParameterBase.defaultValue_ = false;
  (this->Polarization).super_ParameterBase.empty_ = true;
  (this->Polarization).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__Parameter_002f9390;
  (this->Polarization).data_._M_dataplus._M_p = (pointer)&(this->Polarization).data_.field_2;
  local_78 = &(this->Intensity).super_ParameterBase;
  (this->Polarization).data_._M_string_length = 0;
  (this->Polarization).data_.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_e0.first.field_2;
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  local_38 = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"useLight","");
  std::__cxx11::string::_M_assign((string *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->UseLight).super_ParameterBase.optional_ = true;
  (this->UseLight).super_ParameterBase.defaultValue_ = true;
  (this->UseLight).super_ParameterBase.empty_ = false;
  (this->UseLight).super_ParameterBase.field_0x2b = 0;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"useLight","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_40;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"wavelength","");
  std::__cxx11::string::_M_assign(local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Wavelength).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"wavelength","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_50;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"frequency","");
  std::__cxx11::string::_M_assign(local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Frequency).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"frequency","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_60;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"propagationDirection","");
  std::__cxx11::string::_M_assign
            ((string *)&(this->PropagationDirection).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->PropagationDirection).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"propagationDirection","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_68;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"waveVector","");
  std::__cxx11::string::_M_assign((string *)&(this->WaveVector).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->WaveVector).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"waveVector","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_70;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"intensity","");
  std::__cxx11::string::_M_assign((string *)&(this->Intensity).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Intensity).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"intensity","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = local_78;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"polarization","");
  std::__cxx11::string::_M_assign((string *)&(this->Polarization).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  (this->Polarization).super_ParameterBase.optional_ = true;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"polarization","");
  if (local_b8 == &local_a8) {
    local_e0.first.field_2._8_8_ = local_a8._8_8_;
    local_e0.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_e0.first._M_dataplus._M_p = (pointer)local_b8;
  }
  local_e0.first.field_2._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_e0.first.field_2._M_local_buf[0] = local_a8._M_local_buf[0];
  local_e0.first._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_e0.second = &(this->Polarization).super_ParameterBase;
  local_b8 = &local_a8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

LightParameters::LightParameters() {
    DefineOptionalParameterWithDefaultValue(UseLight, "useLight", false);
    DefineOptionalParameter(Wavelength, "wavelength");
    DefineOptionalParameter(Frequency, "frequency");
    DefineOptionalParameter(PropagationDirection, "propagationDirection");
    DefineOptionalParameter(WaveVector, "waveVector");
    DefineOptionalParameter(Intensity, "intensity");
    DefineOptionalParameter(Polarization, "polarization");
  }